

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60dd4::lower_tess_level_visitor::handle_rvalue
          (lower_tess_level_visitor *this,ir_rvalue **rv)

{
  ir_dereference_array *ptr;
  ir_rvalue *op0;
  void *mem_ctx_00;
  ir_expression *this_00;
  ir_expression *expr;
  void *mem_ctx;
  ir_rvalue *lowered_vec4;
  ir_dereference_array *array_deref;
  ir_rvalue **rv_local;
  lower_tess_level_visitor *this_local;
  
  if (((*rv != (ir_rvalue *)0x0) &&
      (ptr = ir_instruction::as_dereference_array(&(*rv)->super_ir_instruction),
      ptr != (ir_dereference_array *)0x0)) &&
     (op0 = lower_tess_level_array(this,ptr->array), op0 != (ir_rvalue *)0x0)) {
    (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    field_0x31 = 1;
    mem_ctx_00 = ralloc_parent(ptr);
    this_00 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx_00);
    ir_expression::ir_expression(this_00,0x8e,op0,ptr->array_index);
    *rv = (ir_rvalue *)this_00;
  }
  return;
}

Assistant:

void
lower_tess_level_visitor::handle_rvalue(ir_rvalue **rv)
{
   if (*rv == NULL)
      return;

   ir_dereference_array *const array_deref = (*rv)->as_dereference_array();
   if (array_deref == NULL)
      return;

   /* Replace any expression that indexes one of the floats in gl_TessLevel*
    * with an expression that indexes into one of the vec4's
    * gl_TessLevel*MESA and accesses the appropriate component.
    */
   ir_rvalue *lowered_vec4 =
      this->lower_tess_level_array(array_deref->array);
   if (lowered_vec4 != NULL) {
      this->progress = true;
      void *mem_ctx = ralloc_parent(array_deref);

      ir_expression *const expr =
         new(mem_ctx) ir_expression(ir_binop_vector_extract,
                                    lowered_vec4,
                                    array_deref->array_index);

      *rv = expr;
   }
}